

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

uint32_t __thiscall spvtools::opt::IRContext::TakeNextId(IRContext *this)

{
  bool bVar1;
  Module *this_00;
  MessageConsumer *pMVar2;
  char *__args_3;
  spv_position_t local_58;
  allocator<char> local_39;
  string local_38 [8];
  string message;
  uint32_t next_id;
  IRContext *this_local;
  
  this_00 = module(this);
  message.field_2._12_4_ = Module::TakeNextIdBound(this_00);
  if (message.field_2._12_4_ == 0) {
    pMVar2 = consumer(this);
    bVar1 = std::function::operator_cast_to_bool((function *)pMVar2);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_38,"ID overflow. Try running compact-ids.",&local_39);
      std::allocator<char>::~allocator(&local_39);
      pMVar2 = consumer(this);
      memset(&local_58,0,0x18);
      __args_3 = (char *)std::__cxx11::string::c_str();
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(pMVar2,SPV_MSG_ERROR,"",&local_58,__args_3);
      std::__cxx11::string::~string(local_38);
    }
  }
  return message.field_2._12_4_;
}

Assistant:

inline uint32_t TakeNextId() {
    uint32_t next_id = module()->TakeNextIdBound();
    if (next_id == 0) {
      if (consumer()) {
        std::string message = "ID overflow. Try running compact-ids.";
        consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
      }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
      // If TakeNextId returns 0, it is very likely that execution will
      // subsequently fail. Such failures are false alarms from a fuzzing point
      // of view: they are due to the fact that too many ids were used, rather
      // than being due to an actual bug. Thus, during a fuzzing build, it is
      // preferable to bail out when ID overflow occurs.
      //
      // A zero exit code is returned here because a non-zero code would cause
      // ClusterFuzz/OSS-Fuzz to regard the termination as a crash, and spurious
      // crash reports is what this guard aims to avoid.
      exit(0);
#endif
    }
    return next_id;
  }